

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdSetIssueAsset(void *handle,void *create_handle,char *txid,uint32_t vout,char *contract_hash,
                    int64_t asset_amount,char *asset_address,char *asset_locking_script,
                    int64_t token_amount,char *token_address,char *token_locking_script,
                    bool is_blind_asset,char **entropy,char **asset_string,char **token_string)

{
  ConfidentialTransactionContext *this;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  CfdException *pCVar5;
  bool is_bitcoin;
  allocator local_b21;
  void *local_b20;
  string local_b18;
  char *work_asset;
  char *work_entropy;
  char *local_ae8;
  undefined8 local_ae0;
  ByteData256 contract_hash_obj;
  OutPoint outpoint;
  IssuanceOutputParameter issuance_data;
  IssuanceOutputParameter token_data;
  IssuanceParameter data;
  
  work_entropy = (char *)0x0;
  work_asset = (char *)0x0;
  local_ae0 = 0;
  local_b20 = handle;
  local_ae8 = contract_hash;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&issuance_data,"TransactionData",(allocator *)&token_data);
  cfd::capi::CheckBuffer(create_handle,(string *)&issuance_data);
  std::__cxx11::string::~string((string *)&issuance_data);
  if (entropy == (char **)0x0) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xac7;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetIssueAsset";
    cfd::core::logger::warn<>((CfdSourceLocation *)&issuance_data,"entropy is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&issuance_data,"Failed to parameter. entropy is null.",
               (allocator *)&token_data);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (txid == (char *)0x0) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xacd;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetIssueAsset";
    cfd::core::logger::warn<>((CfdSourceLocation *)&issuance_data,"txid is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&issuance_data,"Failed to parameter. txid is null.",
               (allocator *)&token_data);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (asset_string == (char **)0x0) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xad3;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetIssueAsset";
    cfd::core::logger::warn<>((CfdSourceLocation *)&issuance_data,"asset_string is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&issuance_data,"Failed to parameter. asset_string is null.",
               (allocator *)&token_data);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (token_string == (char **)0x0 && 0 < token_amount) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xad9;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetIssueAsset";
    cfd::core::logger::warn<>((CfdSourceLocation *)&issuance_data,"token_string is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&issuance_data,"Failed to parameter. token_string is null.",
               (allocator *)&token_data);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (asset_address == (char *)0x0 && asset_locking_script == (char *)0x0) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xadf;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetIssueAsset";
    cfd::core::logger::warn<>
              ((CfdSourceLocation *)&issuance_data,"asset address and script is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&issuance_data,"Failed to parameter. asset address and script is null.",
               (allocator *)&token_data);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (((0 < token_amount) && (token_address == (char *)0x0)) &&
     (token_locking_script == (char *)0x0)) {
    issuance_data.address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x66;
    issuance_data.address.witness_ver_ = 0xae6;
    issuance_data.address.address_._M_dataplus._M_p = "CfdSetIssueAsset";
    cfd::core::logger::warn<>
              ((CfdSourceLocation *)&issuance_data,"token address and script is null.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&issuance_data,"Failed to parameter. token address and script is null.",
               (allocator *)&token_data);
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&issuance_data);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
  this = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
  if (this == (ConfidentialTransactionContext *)0x0) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&issuance_data,"Invalid handle state. tx is null",(allocator *)&token_data)
    ;
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&issuance_data);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin != true) {
    std::__cxx11::string::string((string *)&token_data,txid,(allocator *)&data);
    cfd::core::Txid::Txid((Txid *)&issuance_data,(string *)&token_data);
    cfd::core::OutPoint::OutPoint(&outpoint,(Txid *)&issuance_data,vout);
    cfd::core::Txid::~Txid((Txid *)&issuance_data);
    std::__cxx11::string::~string((string *)&token_data);
    cfd::capi::ConvertToIssuanceParameter(&issuance_data,asset_address,asset_locking_script);
    cfd::core::Amount::Amount((Amount *)&token_data,asset_amount);
    pcVar2 = local_ae8;
    issuance_data.amount.ignore_check_ = (bool)(undefined1)token_data.address.witness_ver_;
    issuance_data.amount.amount_._0_4_ = token_data.address.type_;
    issuance_data.amount.amount_._4_4_ = token_data.address.addr_type_;
    cfd::IssuanceOutputParameter::IssuanceOutputParameter(&token_data);
    if (0 < token_amount) {
      cfd::capi::ConvertToIssuanceParameter
                ((IssuanceOutputParameter *)&data,token_address,token_locking_script);
      cfd::IssuanceOutputParameter::operator=(&token_data,(IssuanceOutputParameter *)&data);
      cfd::IssuanceOutputParameter::~IssuanceOutputParameter((IssuanceOutputParameter *)&data);
      cfd::core::Amount::Amount((Amount *)&data,token_amount);
      token_data.amount.ignore_check_ =
           (bool)data.entropy.data_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start._0_1_;
      token_data.amount.amount_ = (int64_t)data.entropy._vptr_BlindFactor;
    }
    cfd::core::ByteData256::ByteData256(&contract_hash_obj);
    bVar1 = cfd::capi::IsEmptyString(pcVar2);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&data,pcVar2,&local_b21);
      cfd::core::ByteData256::ByteData256((ByteData256 *)&local_b18,(string *)&data);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&contract_hash_obj,
                 &local_b18);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b18);
      std::__cxx11::string::~string((string *)&data);
    }
    cfd::ConfidentialTransactionContext::SetAssetIssuance
              (&data,this,&outpoint,&issuance_data.amount,&issuance_data,&token_data.amount,
               &token_data,is_blind_asset,&contract_hash_obj);
    cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_b18,&data.entropy);
    pcVar2 = cfd::capi::CreateString(&local_b18);
    work_entropy = pcVar2;
    std::__cxx11::string::~string((string *)&local_b18);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_b18,&data.asset);
    pcVar3 = cfd::capi::CreateString(&local_b18);
    work_asset = pcVar3;
    std::__cxx11::string::~string((string *)&local_b18);
    if (token_string == (char **)0x0) {
      *entropy = pcVar2;
      *asset_string = pcVar3;
    }
    else {
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_b18,&data.token);
      pcVar4 = cfd::capi::CreateString(&local_b18);
      std::__cxx11::string::~string((string *)&local_b18);
      *entropy = pcVar2;
      *asset_string = pcVar3;
      *token_string = pcVar4;
    }
    cfd::core::IssuanceParameter::~IssuanceParameter(&data);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&contract_hash_obj);
    cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&token_data);
    cfd::IssuanceOutputParameter::~IssuanceOutputParameter(&issuance_data);
    cfd::core::Txid::~Txid(&outpoint.txid_);
    return 0;
  }
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&issuance_data,"Invalid handle state. tx is bitcoin.",
             (allocator *)&token_data);
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalStateError,(string *)&issuance_data);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSetIssueAsset(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    const char* contract_hash, int64_t asset_amount, const char* asset_address,
    const char* asset_locking_script, int64_t token_amount,
    const char* token_address, const char* token_locking_script,
    bool is_blind_asset, char** entropy, char** asset_string,
    char** token_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_entropy = nullptr;
  char* work_asset = nullptr;
  char* work_token = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (entropy == nullptr) {
      warn(CFD_LOG_SOURCE, "entropy is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. entropy is null.");
    }
    if (txid == nullptr) {
      warn(CFD_LOG_SOURCE, "txid is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null.");
    }
    if (asset_string == nullptr) {
      warn(CFD_LOG_SOURCE, "asset_string is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset_string is null.");
    }
    if ((token_amount > 0) && (token_string == nullptr)) {
      warn(CFD_LOG_SOURCE, "token_string is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. token_string is null.");
    }
    if ((asset_address == nullptr) && (asset_locking_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "asset address and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset address and script is null.");
    }
    if ((token_amount > 0) && (token_address == nullptr) &&
        (token_locking_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "token address and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. token address and script is null.");
    }
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    OutPoint outpoint(Txid(txid), vout);
    cfd::IssuanceOutputParameter issuance_data =
        ConvertToIssuanceParameter(asset_address, asset_locking_script);
    issuance_data.amount = Amount(asset_amount);
    cfd::IssuanceOutputParameter token_data;
    if (token_amount > 0) {
      token_data =
          ConvertToIssuanceParameter(token_address, token_locking_script);
      token_data.amount = Amount(token_amount);
    }
    ByteData256 contract_hash_obj;
    if (!IsEmptyString(contract_hash)) {
      contract_hash_obj = ByteData256(contract_hash);
    }

    auto data = tx->SetAssetIssuance(
        outpoint, issuance_data.amount, issuance_data, token_data.amount,
        token_data, is_blind_asset, contract_hash_obj);

    work_entropy = CreateString(data.entropy.GetHex());
    work_asset = CreateString(data.asset.GetHex());
    if (token_string != nullptr) {
      work_token = CreateString(data.token.GetHex());
    }

    *entropy = work_entropy;
    *asset_string = work_asset;
    if (token_string != nullptr) *token_string = work_token;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_entropy, &work_asset, &work_token);
  return result;
}